

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.c
# Opt level: O0

void ly_set_erase(ly_set *set,_func_void_void_ptr *destructor)

{
  _func_void_void_ptr *destructor_local;
  ly_set *set_local;
  
  if (set != (ly_set *)0x0) {
    ly_set_clean(set,destructor);
    free((set->field_2).dnodes);
    set->size = 0;
    (set->field_2).dnodes = (lyd_node **)0x0;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
ly_set_erase(struct ly_set *set, void (*destructor)(void *obj))
{
    if (!set) {
        return;
    }

    ly_set_clean(set, destructor);

    free(set->objs);
    set->size = 0;
    set->objs = NULL;
}